

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

int __thiscall Imf_3_2::DeepTiledInputFile::numYTiles(DeepTiledInputFile *this,int ly)

{
  char *pcVar1;
  ostream *poVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((-1 < ly) && (ly < this->_data->numYLevels)) {
    return this->_data->numYTiles[(uint)ly];
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Error calling numYTiles() on image file \"",0x29);
  pcVar1 = IStream::fileName(this->_data->_streamData->is);
  poVar2 = std::operator<<(local_188,pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\" (Argument is not in valid range).",0x23);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

int
DeepTiledInputFile::numYTiles (int ly) const
{
    if (ly < 0 || ly >= _data->numYLevels)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error calling numYTiles() on image "
            "file \""
                << _data->_streamData->is->fileName ()
                << "\" "
                   "(Argument is not in valid range).");
    }

    return _data->numYTiles[ly];
}